

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attributes_encoder.h
# Opt level: O2

bool __thiscall
draco::AttributesEncoder::EncodeAttributes(AttributesEncoder *this,EncoderBuffer *out_buffer)

{
  int iVar1;
  
  iVar1 = (*this->_vptr_AttributesEncoder[10])();
  if ((char)iVar1 != '\0') {
    iVar1 = (*this->_vptr_AttributesEncoder[0xb])(this,out_buffer);
    if ((char)iVar1 != '\0') {
      iVar1 = (*this->_vptr_AttributesEncoder[0xc])(this,out_buffer);
      return SUB41(iVar1,0);
    }
  }
  return false;
}

Assistant:

virtual bool EncodeAttributes(EncoderBuffer *out_buffer) {
    if (!TransformAttributesToPortableFormat()) {
      return false;
    }
    if (!EncodePortableAttributes(out_buffer)) {
      return false;
    }
    // Encode data needed by portable transforms after the attribute is encoded.
    // This corresponds to the order in which the data is going to be decoded by
    // the decoder.
    if (!EncodeDataNeededByPortableTransforms(out_buffer)) {
      return false;
    }
    return true;
  }